

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Environmental_Process_PDU.cpp
# Opt level: O0

KString * __thiscall
KDIS::PDU::Environmental_Process_PDU::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Environmental_Process_PDU *this)

{
  bool bVar1;
  ostream *poVar2;
  reference this_00;
  EnvironmentRecord *pEVar3;
  string local_260 [32];
  __normal_iterator<const_KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>_>_>_>
  local_240;
  const_iterator citrEnd;
  const_iterator citr;
  KString local_210;
  KString local_1f0;
  KString local_1c0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  Environmental_Process_PDU *local_18;
  Environmental_Process_PDU *this_local;
  
  local_18 = this;
  this_local = (Environmental_Process_PDU *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  Header7::GetAsString_abi_cxx11_(&local_1c0,&this->super_Header);
  poVar2 = std::operator<<(local_190,(string *)&local_1c0);
  poVar2 = std::operator<<(poVar2,"-Environmental Process PDU-\n");
  poVar2 = std::operator<<(poVar2,"Environmental Process ID:\n");
  DATA_TYPE::EntityIdentifier::GetAsString_abi_cxx11_(&local_210,&this->m_EnvProcID);
  UTILS::IndentString(&local_1f0,&local_210,1,'\t');
  poVar2 = std::operator<<(poVar2,(string *)&local_1f0);
  poVar2 = std::operator<<(poVar2,"Environment Type: ");
  DATA_TYPE::EnvironmentType::GetAsString_abi_cxx11_((KString *)&citr,&this->m_EnvType);
  poVar2 = std::operator<<(poVar2,(string *)&citr);
  poVar2 = std::operator<<(poVar2,"Model Type:       ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(ushort)this->m_ui8ModelType);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"Environment Status:\n");
  poVar2 = std::operator<<(poVar2,"\tLast PDU: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(this->field_3).m_ui8EnvStatus & 1);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"\tActive: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(this->field_3).m_ui8EnvStatus >> 1 & 1);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"Number Of Environment Records: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->m_ui16NumEnvRec);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"Sequence Number: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->m_ui16SeqNum);
  std::operator<<(poVar2,"\n");
  std::__cxx11::string::~string((string *)&citr);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1c0);
  citrEnd = std::
            vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>_>_>
            ::begin(&this->m_vEnvRecords);
  local_240._M_current =
       (KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord> *)
       std::
       vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>_>_>
       ::end(&this->m_vEnvRecords);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&citrEnd,&local_240);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<const_KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>_>_>_>
              ::operator*(&citrEnd);
    pEVar3 = UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>::operator->(this_00);
    (*(pEVar3->super_DataTypeBase)._vptr_DataTypeBase[2])(local_260);
    std::operator<<(local_190,local_260);
    std::__cxx11::string::~string(local_260);
    __gnu_cxx::
    __normal_iterator<const_KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>_>_>_>
    ::operator++(&citrEnd);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString Environmental_Process_PDU::GetAsString() const
{
    KStringStream ss;

    ss << Header::GetAsString()
       << "-Environmental Process PDU-\n"
       << "Environmental Process ID:\n"
       << IndentString( m_EnvProcID.GetAsString(), 1 )
       << "Environment Type: "             << m_EnvType.GetAsString()
       << "Model Type:       "             << ( KUINT16 )m_ui8ModelType     << "\n"
       << "Environment Status:\n"
       << "\tLast PDU: "                   << ( KUINT16 )m_ui8EnvStatusBit0 << "\n"
       << "\tActive: "                     << ( KUINT16 )m_ui8EnvStatusBit1 << "\n"
       << "Number Of Environment Records: " << m_ui16NumEnvRec              << "\n"
       << "Sequence Number: "              << m_ui16SeqNum                  << "\n";

    vector<EnvironmentRecordPtr>::const_iterator citr = m_vEnvRecords.begin();
    vector<EnvironmentRecordPtr>::const_iterator citrEnd = m_vEnvRecords.end();

    for( ; citr != citrEnd; ++citr )
    {
        ss << ( *citr )->GetAsString();
    }

    return ss.str();
}